

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

string * __thiscall pbrt::TexInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,TexInfo *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<std::__cxx11::string_const&,std::__cxx11::string_const&,float_const&,pbrt::WrapMode_const&,pbrt::ColorEncodingHandle_const&>
            (__return_storage_ptr__,
             "[ TexInfo filename: %s filter: %s maxAniso: %f wrapMode: %s encoding: %s ]",
             &this->filename,&this->filter,&this->maxAniso,&this->wrapMode,&this->encoding);
  return __return_storage_ptr__;
}

Assistant:

std::string TexInfo::ToString() const {
    return StringPrintf("[ TexInfo filename: %s filter: %s maxAniso: %f "
                        "wrapMode: %s encoding: %s ]",
                        filename, filter, maxAniso, wrapMode, encoding);
}